

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O0

int stmm_add_direct(stmm_table *table,char *key,char *value)

{
  int iVar1;
  stmm_table_entry *psVar2;
  int local_48;
  int local_44;
  stmm_table_entry *newEntry;
  int hash_val;
  char *value_local;
  char *key_local;
  stmm_table *table_local;
  
  if (table->hash != stmm_ptrhash) {
    if (table->hash == stmm_numhash) {
      Abc_AbsInt((int)key);
    }
    else {
      (*table->hash)(key,table->num_bins);
    }
  }
  if ((table->num_entries / table->num_bins < table->max_density) ||
     (iVar1 = rehash(table), iVar1 != -10000)) {
    if (table->hash == stmm_ptrhash) {
      local_44 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
    }
    else {
      if (table->hash == stmm_numhash) {
        local_48 = Abc_AbsInt((int)key);
        local_48 = local_48 % table->num_bins;
      }
      else {
        local_48 = (*table->hash)(key,table->num_bins);
      }
      local_44 = local_48;
    }
    psVar2 = (stmm_table_entry *)Extra_MmFixedEntryFetch((Extra_MmFixed_t *)table->pMemMan);
    if (psVar2 == (stmm_table_entry *)0x0) {
      table_local._4_4_ = -10000;
    }
    else {
      psVar2->key = key;
      psVar2->record = value;
      psVar2->next = table->bins[local_44];
      table->bins[local_44] = psVar2;
      table->num_entries = table->num_entries + 1;
      table_local._4_4_ = 1;
    }
  }
  else {
    table_local._4_4_ = -10000;
  }
  return table_local._4_4_;
}

Assistant:

int
stmm_add_direct (stmm_table *table, char *key, char *value)
{
    int hash_val;
    stmm_table_entry *newEntry;

    hash_val = do_hash (key, table);
    if (table->num_entries / table->num_bins >= table->max_density) {
    if (rehash (table) == STMM_OUT_OF_MEM) {
        return STMM_OUT_OF_MEM;
    }
    }
    hash_val = do_hash (key, table);

//      newEntry = ABC_ALLOC( stmm_table_entry, 1 );
    newEntry = (stmm_table_entry *) Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)table->pMemMan);
    if (newEntry == NULL) {
    return STMM_OUT_OF_MEM;
    }

    newEntry->key = key;
    newEntry->record = value;
    newEntry->next = table->bins[hash_val];
    table->bins[hash_val] = newEntry;
    table->num_entries++;
    return 1;
}